

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int archive_read_format_rar_cleanup(archive_read *a)

{
  long in_RDI;
  rar *rar;
  ISzAlloc *in_stack_ffffffffffffffe8;
  CPpmd7 *p;
  
  p = (CPpmd7 *)**(undefined8 **)(in_RDI + 0x948);
  free_codes((archive_read *)p);
  free(p->LoUnit);
  free(p->HiUnit);
  free(*(void **)(p->Units2Indx + 0x66));
  free(*(archive_seek_callback **)(p->Units2Indx + 0x46));
  free(*(char **)(p->NS2BSIndx + 0x74));
  Ppmd7_Free(p,in_stack_ffffffffffffffe8);
  free(p);
  **(undefined8 **)(in_RDI + 0x948) = 0;
  return 0;
}

Assistant:

static int
archive_read_format_rar_cleanup(struct archive_read *a)
{
  struct rar *rar;

  rar = (struct rar *)(a->format->data);
  free_codes(a);
  free(rar->filename);
  free(rar->filename_save);
  free(rar->dbo);
  free(rar->unp_buffer);
  free(rar->lzss.window);
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
  free(rar);
  (a->format->data) = NULL;
  return (ARCHIVE_OK);
}